

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::DescriptorPool>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  deUint32 maxResourceConsumers_;
  EnvClone *pEVar1;
  reference pvVar2;
  Resources *pRVar3;
  reference pvVar4;
  CreateThread<vkt::api::(anonymous_namespace)::DescriptorPool> *this;
  DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread> local_121;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_120;
  SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources> local_110;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_100;
  uint local_ec;
  undefined1 local_e8 [4];
  deUint32 ndx;
  ThreadGroup threads;
  undefined1 local_b0 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
  resources;
  allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_> local_81;
  undefined1 local_80 [8];
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  Environment sharedEnv;
  Parameters deviceParams;
  deUint32 numThreads;
  Parameters *params_local;
  Context *context_local;
  
  maxResourceConsumers_ = getDefaultTestThreadCount();
  register0x00000000 = getDefaulDeviceParameters(context);
  Environment::Environment
            ((Environment *)
             &perThreadEnv.
              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,context,maxResourceConsumers_);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::allocator(&local_81);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            *)local_80,(ulong)maxResourceConsumers_,&local_81);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>::~allocator(&local_81);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>::
  allocator((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_> *
            )&threads.field_0x2f);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
  ::vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
            *)local_b0,(ulong)maxResourceConsumers_,(allocator_type *)&threads.field_0x2f);
  std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>::
  ~allocator((allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>
              *)&threads.field_0x2f);
  ThreadGroup::ThreadGroup((ThreadGroup *)local_e8);
  for (local_ec = 0; local_ec < maxResourceConsumers_; local_ec = local_ec + 1) {
    pEVar1 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(pEVar1,(Environment *)
                              &perThreadEnv.
                               super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Parameters *)&sharedEnv.field_0x34,1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_100,pEVar1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_80,(ulong)local_ec);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(pvVar2,&local_100);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::~SharedPtr(&local_100);
    pRVar3 = (Resources *)operator_new(1);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_80,(ulong)local_ec);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    DescriptorPool::Resources::Resources(pRVar3,&pEVar1->env,params);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>::SharedPtr
              (&local_110,pRVar3);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
                           *)local_b0,(ulong)local_ec);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>::operator=
              (pvVar4,&local_110);
    de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>::~SharedPtr
              (&local_110);
    this = (CreateThread<vkt::api::(anonymous_namespace)::DescriptorPool> *)operator_new(0x88);
    pvVar2 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                           *)local_80,(ulong)local_ec);
    pEVar1 = de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator->(pvVar2);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
                           *)local_b0,(ulong)local_ec);
    pRVar3 = de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>::operator*
                       (pvVar4);
    CreateThread<vkt::api::(anonymous_namespace)::DescriptorPool>::CreateThread
              (this,&pEVar1->env,pRVar3,params);
    de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>::DefaultDeleter
              (&local_121);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::MovePtr(&local_120,this);
    ThreadGroup::add((ThreadGroup *)local_e8,&local_120);
    de::details::
    MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    ::~MovePtr(&local_120);
  }
  ThreadGroup::run(__return_storage_ptr__,(ThreadGroup *)local_e8);
  ThreadGroup::~ThreadGroup((ThreadGroup *)local_e8);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::DescriptorPool::Resources>_>_>
             *)local_b0);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector((vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}